

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Position.cpp
# Opt level: O0

Position * __thiscall iDynTree::Position::changeRefPoint(Position *this,Position *newRefPoint)

{
  VectorFixSize<3U> *in_RSI;
  Position *in_RDI;
  double dVar1;
  
  dVar1 = VectorFixSize<3U>::operator()(in_RSI,0);
  (in_RDI->super_Vector3).m_data[0] = dVar1 + (in_RDI->super_Vector3).m_data[0];
  dVar1 = VectorFixSize<3U>::operator()(in_RSI,1);
  (in_RDI->super_Vector3).m_data[1] = dVar1 + (in_RDI->super_Vector3).m_data[1];
  dVar1 = VectorFixSize<3U>::operator()(in_RSI,2);
  (in_RDI->super_Vector3).m_data[2] = dVar1 + (in_RDI->super_Vector3).m_data[2];
  return in_RDI;
}

Assistant:

const Position& Position::changeRefPoint(const Position& newRefPoint)
    {
        this->m_data[0] += newRefPoint(0);
        this->m_data[1] += newRefPoint(1);
        this->m_data[2] += newRefPoint(2);

        return *this;
    }